

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry_iterator.cpp
# Opt level: O2

entry_iterator * __thiscall
Pathie::entry_iterator::operator=(entry_iterator *this,entry_iterator *other)

{
  void *pvVar1;
  Path *this_00;
  
  pvVar1 = other->mp_cur;
  this->mp_directory = other->mp_directory;
  this->mp_cur = pvVar1;
  this->mp_cur_path = other->mp_cur_path;
  other->mp_directory = (Path *)0x0;
  other->mp_cur = (void *)0x0;
  this_00 = (Path *)operator_new(0x20);
  Path::Path(this_00);
  other->mp_cur_path = this_00;
  return this;
}

Assistant:

entry_iterator& entry_iterator::operator=(const entry_iterator& other)
{
  mp_directory      = other.mp_directory;
  mp_cur            = other.mp_cur;
  mp_cur_path       = other.mp_cur_path;

  entry_iterator& e = const_cast<entry_iterator&>(other);
  e.mp_directory    = NULL;
  e.mp_cur          = NULL;
  e.mp_cur_path     = new Path();

  return *this;
}